

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_codepoint<8ul,char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char prefix,uint32_t cp)

{
  bool bVar1;
  char *pcVar2;
  char buf [8];
  
  buf = (char  [8])out.container;
  basic_appender<char>::operator=((basic_appender<char> *)buf,'\\');
  buf = (char  [8])out.container;
  basic_appender<char>::operator=((basic_appender<char> *)buf,prefix);
  builtin_strncpy(buf,"00000000",8);
  pcVar2 = buf + 7;
  do {
    *pcVar2 = "0123456789abcdef"[cp & 0xf];
    pcVar2 = pcVar2 + -1;
    bVar1 = 0xf < cp;
    cp = cp >> 4;
  } while (bVar1);
  buffer<char>::append<char>(out.container,buf,&stack0xffffffffffffffe0);
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_base2e(4, buf, cp, width);
  return copy<Char>(buf, buf + width, out);
}